

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

bool IsRainbowArtsTrack(Track *track,int *weak_offset,int *weak_size)

{
  bool bVar1;
  int iVar2;
  Sector *this;
  Sector *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  uchar *__s1;
  Data *data3;
  Sector *sector3;
  Sector *sector1;
  int *weak_size_local;
  int *weak_offset_local;
  Track *track_local;
  
  iVar2 = Track::size(track);
  if (iVar2 == 9) {
    this = Track::operator[](track,1);
    this_00 = Track::operator[](track,3);
    if ((((((this->encoding == MFM) && (this_00->encoding == MFM)) && (this->datarate == _250K)) &&
         ((this_00->datarate == _250K && (iVar2 = Sector::size(this), iVar2 == 0x200)))) &&
        ((iVar2 = Sector::size(this_00), iVar2 == 0x200 &&
         ((iVar2 = Sector::data_size(this), 0x1ff < iVar2 &&
          (iVar2 = Sector::data_size(this_00), 0x1ff < iVar2)))))) &&
       (((this->header).sector == 0xc6 && (bVar1 = Sector::has_baddatacrc(this), bVar1)))) {
      this_01 = &Sector::data_copy(this_00,0)->
                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      __s1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this_01);
      iVar2 = memcmp(__s1,anon_var_dwarf_1a5397,0xe);
      if (iVar2 == 0) {
        *weak_offset = 100;
        *weak_size = 0x100;
        if (opt.debug != 0) {
          util::operator<<((LogHelper *)&util::cout,
                           (char (*) [41])"detected Rainbow Arts weak sector track\n");
        }
        return true;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool IsRainbowArtsTrack(const Track& track, int& weak_offset, int& weak_size)
{
    if (track.size() != 9)
        return false;

    auto& sector1 = track[1];
    auto& sector3 = track[3];

    if (sector1.encoding != Encoding::MFM || sector3.encoding != Encoding::MFM ||
        sector1.datarate != DataRate::_250K || sector3.datarate != DataRate::_250K ||
        sector1.size() != 512 || sector3.size() != 512 ||
        sector1.data_size() < 512 || sector3.data_size() < 512 ||
        sector1.header.sector != 198 || !sector1.has_baddatacrc())  // weak sector 198
        return false;

    auto& data3 = sector3.data_copy();

    // Check for code signature at the start of the 4th sector
    if (memcmp(data3.data(), "\x2a\x6d\xa7\x01\x30\x01\xaf\xed\x42\x4d\x44\x21\x70\x01", 14))
        return false;

    // The first 100 bytes are constant
    weak_offset = 100;  // =100 -258 +151 -3
    weak_size = 256;

    if (opt.debug) util::cout << "detected Rainbow Arts weak sector track\n";
    return true;
}